

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_definitions_section.cpp
# Opt level: O1

ostream * pstore::repo::operator<<(ostream *os,value_type *ld)

{
  ostream *poVar1;
  char local_24 [4];
  address local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{compilation:",0xd);
  local_24[0] = '{';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,local_24,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_24[1] = 0x2c;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_24 + 1,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_24[2] = 0x7d;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_24 + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", index:",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", unused:",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", pointer:",10);
  local_20.a_ = (ld->pointer).a_.a_;
  poVar1 = pstore::operator<<(poVar1,&local_20);
  local_24[3] = 0x7d;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_24 + 3,1);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, linked_definitions::value_type const & ld) {
            return os << "{compilation:" << ld.compilation << ", index:" << ld.index
                      << ", unused:" << ld.unused << ", pointer:" << ld.pointer << '}';
        }